

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdFinalizePsbt(void *handle,void *psbt_handle)

{
  CfdException *this;
  allocator local_49;
  undefined1 local_48 [32];
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)local_48,"PsbtHandle",&local_49);
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  if (*(Psbt **)((long)psbt_handle + 0x18) != (Psbt *)0x0) {
    cfd::core::Psbt::Finalize(*(Psbt **)((long)psbt_handle + 0x18));
    return 0;
  }
  local_48._0_8_ = "cfdcapi_psbt.cpp";
  local_48._8_4_ = 0x20c;
  local_48._16_8_ = "CfdFinalizePsbt";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_48,"psbt is null.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_48,"Failed to handle statement. psbt is null.",&local_49);
  cfd::core::CfdException::CfdException(this,kCfdIllegalStateError,(string *)local_48);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdFinalizePsbt(void* handle, void* psbt_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    psbt_obj->psbt->Finalize();
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}